

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flFTP.cpp
# Opt level: O3

int __thiscall Rainbow::CommPort::Cd(CommPort *this,string *path)

{
  int iVar1;
  size_t n;
  char message [512];
  char command [512];
  string local_448;
  undefined1 local_428 [512];
  char local_228 [520];
  
  memset(local_228,0,0x200);
  snprintf(local_228,0x200,"CWD %s\r\n");
  n = strlen(local_228);
  iVar1 = Send(this,local_228,n,0);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    memset(local_428,0,0x200);
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"250","");
    iVar1 = Recv(this,local_428,0x1ff,0,&local_448,&this->_errorMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    iVar1 = iVar1 >> 0x1f;
  }
  return iVar1;
}

Assistant:

int CommPort::Cd(const std::string &path)
	{
		char command[BUFFER] = {0};
		snprintf(command, BUFFER, "CWD %s\r\n", path.c_str());

		if(Send(command, strlen(command), 0) < 0)
			return -1;
		
		char message[BUFFER] = {0};
		if(Recv(message, BUFFER - 1, 0, FTP_DIR_CHANGE, _errorMessage) < 0)
			return -1;

		return 0;
	}